

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O3

natwm_error color_theme_from_config(map *map,char *key,color_theme **result)

{
  config_array *pcVar1;
  natwm_error nVar2;
  color_theme *theme;
  char *fmt;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar3;
  config_array *local_30;
  config_array *config_value;
  
  uVar3 = 0x104320;
  local_30 = (config_array *)0x0;
  nVar2 = config_find_array(map,key,&local_30);
  pcVar1 = local_30;
  if (nVar2 == NO_ERROR) {
    if (local_30->length == 4) {
      theme = (color_theme *)calloc(1,0x20);
      if (theme == (color_theme *)0x0) {
        internal_logger(natwm_logger,LEVEL_ERROR,"Failed while allocating theme value");
        return MEMORY_ALLOCATION_ERROR;
      }
      nVar2 = color_value_from_config_value(*pcVar1->values,(color_value **)theme);
      if (nVar2 == NO_ERROR) {
        nVar2 = color_value_from_config_value(local_30->values[1],&theme->focused);
        if (nVar2 == NO_ERROR) {
          nVar2 = color_value_from_config_value(local_30->values[2],&theme->urgent);
          if (nVar2 == NO_ERROR) {
            nVar2 = color_value_from_config_value(local_30->values[3],&theme->sticky);
            if (nVar2 == NO_ERROR) {
              *result = theme;
              return NO_ERROR;
            }
            fmt = "Invalid sticky color value found in \'%s\'";
          }
          else {
            fmt = "Invalid urgent color value found in \'%s\'";
          }
        }
        else {
          fmt = "Invalid focused color value found in \'%s\'";
        }
      }
      else {
        fmt = "Invalid unfocused color value found in \'%s\'";
      }
      internal_logger(natwm_logger,LEVEL_ERROR,fmt,key,in_R8,in_R9,uVar3);
      color_theme_destroy(theme);
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,
                      "Invalid number of values for config item \'%s\', Expected 4",key,in_R8,in_R9,
                      uVar3);
    }
    nVar2 = INVALID_INPUT_ERROR;
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find config item for \'%s\'",key,in_R8,in_R9
                    ,uVar3);
  }
  return nVar2;
}

Assistant:

enum natwm_error color_theme_from_config(const struct map *map, const char *key,
                                         struct color_theme **result)
{
        const struct config_array *config_value = NULL;
        enum natwm_error err = config_find_array(map, key, &config_value);

        if (err != NO_ERROR) {
                if (NOT_FOUND_ERROR) {
                        LOG_ERROR(natwm_logger, "Failed to find config item for '%s'", key);
                } else {
                        LOG_ERROR(natwm_logger, "Invalid color values for config item '%s'", key);
                }

                return err;
        }

        // TODO: It might be better in the future to leave unset config values
        // as NULL and have a fallback. That way users could just override the
        // values they wanted to change.
        if (config_value->length != 4) {
                LOG_ERROR(natwm_logger,
                          "Invalid number of values for config item '%s', "
                          "Expected 4",
                          key);

                return INVALID_INPUT_ERROR;
        }

        struct color_theme *theme = color_theme_create();

        if (theme == NULL) {
                LOG_ERROR(natwm_logger, "Failed while allocating theme value");

                return MEMORY_ALLOCATION_ERROR;
        }

        err = color_value_from_config_value(config_value->values[0], &theme->unfocused);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Invalid unfocused color value found in '%s'", key);

                goto invalid_color_value_error;
        }

        err = color_value_from_config_value(config_value->values[1], &theme->focused);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Invalid focused color value found in '%s'", key);

                goto invalid_color_value_error;
        }

        err = color_value_from_config_value(config_value->values[2], &theme->urgent);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Invalid urgent color value found in '%s'", key);

                goto invalid_color_value_error;
        }

        err = color_value_from_config_value(config_value->values[3], &theme->sticky);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Invalid sticky color value found in '%s'", key);

                goto invalid_color_value_error;
        }

        *result = theme;

        return NO_ERROR;

invalid_color_value_error:
        color_theme_destroy(theme);

        return INVALID_INPUT_ERROR;
}